

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O1

void do_cmd_wiz_teleport_random(command *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  source sVar3;
  source origin;
  wchar_t range;
  char sr [30];
  
  wVar2 = cmd_get_arg_number((command_conflict *)cmd,"range",&range);
  if (wVar2 != L'\0') {
    sr[8] = '\0';
    sr[9] = '\0';
    sr[10] = '\0';
    sr[0xb] = '\0';
    sr[0xc] = '\0';
    sr[0xd] = '\0';
    sr[0xe] = '\0';
    sr[0xf] = '\0';
    sr[0x10] = '\0';
    sr[0x11] = '\0';
    sr[0x12] = '\0';
    sr[0x13] = '\0';
    sr[0x14] = '\0';
    sr[0x15] = '\0';
    sr[0x16] = '\0';
    sr[0x17] = '\0';
    stack0xffffffffffffffb0 = 0;
    sr[0] = '1';
    sr[1] = '0';
    sr[2] = '0';
    sr[3] = '\0';
    sr[4] = '\0';
    sr[5] = '\0';
    sr[6] = '\0';
    sr[7] = '\0';
    _Var1 = get_string("Teleport range? ",sr,0x50);
    if (!_Var1) {
      return;
    }
    _Var1 = get_int_from_string(sr,&range);
    if (range < L'\x01' || !_Var1) {
      return;
    }
    cmd_set_arg_number((command_conflict *)cmd,"range",range);
  }
  strnfmt(sr,0x1e,"%d",(ulong)(uint)range);
  sVar3 = source_player();
  origin.which = sVar3.which;
  origin._4_4_ = 0;
  origin.what = sVar3.what;
  effect_simple(L';',origin,sr,L'\0',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
  return;
}

Assistant:

void do_cmd_wiz_teleport_random(struct command *cmd)
{
	int range;
	char sr[30];

	if (cmd_get_arg_number(cmd, "range", &range) != CMD_OK) {
		char s[80] = "100";

		if (!get_string("Teleport range? ", s, sizeof(s))) return;
		if (!get_int_from_string(s, &range) || range < 1) return;
		cmd_set_arg_number(cmd, "range", range);
	}

	strnfmt(sr, sizeof(sr), "%d", range);
	effect_simple(EF_TELEPORT, source_player(), sr, 0, 0, 0, 0, 0, NULL);
}